

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui-SFML.cpp
# Opt level: O2

bool ImGui::ImageButton(Sprite *sprite,Vector2f *size,int framePadding,Color *bgColor,
                       Color *tintColor)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  bool bVar5;
  uint uVar6;
  Texture *this;
  IntRect *pIVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  ImVec2 local_80;
  Vector2u local_78;
  undefined8 uStack_70;
  Vector2f local_60;
  ImVec2 local_58;
  ImVec4 local_50;
  ImVec4 local_40;
  
  this = sf::Sprite::getTexture(sprite);
  if (this == (Texture *)0x0) {
    bVar5 = false;
  }
  else {
    local_78 = sf::Texture::getSize(this);
    uStack_70 = 0;
    pIVar7 = sf::Sprite::getTextureRect(sprite);
    auVar11._0_8_ = (ulong)local_78 & 0xffffffff;
    auVar11._8_4_ = local_78.y;
    auVar11._12_4_ = 0;
    auVar9._0_4_ = (float)(SUB168(auVar11 | _DAT_001c1e60,0) - (double)DAT_001c1e60);
    auVar9._4_4_ = (float)(SUB168(auVar11 | _DAT_001c1e60,8) - DAT_001c1e60._8_8_);
    auVar9._8_8_ = 0;
    uVar1 = pIVar7->left;
    uVar3 = pIVar7->top;
    auVar10._0_4_ = (float)(int)uVar1;
    auVar10._4_4_ = (float)(int)uVar3;
    auVar10._8_8_ = 0;
    auVar11 = divps(auVar10,auVar9);
    local_80 = auVar11._0_8_;
    uVar2 = pIVar7->width;
    uVar4 = pIVar7->height;
    auVar8._0_4_ = (float)(int)(uVar2 + uVar1);
    auVar8._4_4_ = (float)(int)(uVar4 + uVar3);
    auVar8._8_8_ = 0;
    auVar9 = divps(auVar8,auVar9);
    local_58 = auVar9._0_8_;
    uVar6 = sf::Texture::getNativeHandle(this);
    local_60 = *size;
    local_40 = (ImVec4)anon_unknown.dwarf_115aec::toImColor(*bgColor);
    local_50 = (ImVec4)anon_unknown.dwarf_115aec::toImColor(*tintColor);
    bVar5 = ImageButton((ImTextureID)(ulong)uVar6,(ImVec2 *)&local_60,&local_80,&local_58,
                        framePadding,&local_40,&local_50);
  }
  return bVar5;
}

Assistant:

bool ImageButton(const sf::Sprite& sprite, const sf::Vector2f& size, const int framePadding,
                 const sf::Color& bgColor, const sf::Color& tintColor) {
    const sf::Texture* texturePtr = sprite.getTexture();
    // sprite without texture cannot be drawn
    if (!texturePtr) {
        return false;
    }

    const sf::Texture& texture = *texturePtr;
    sf::Vector2f textureSize = static_cast<sf::Vector2f>(texture.getSize());
    const sf::IntRect& textureRect = sprite.getTextureRect();
    ImVec2 uv0(textureRect.left / textureSize.x, textureRect.top / textureSize.y);
    ImVec2 uv1((textureRect.left + textureRect.width) / textureSize.x,
               (textureRect.top + textureRect.height) / textureSize.y);

    ImTextureID textureID = convertGLTextureHandleToImTextureID(texture.getNativeHandle());
    return ImGui::ImageButton(textureID, ImVec2(size.x, size.y), uv0, uv1, framePadding,
                              toImColor(bgColor), toImColor(tintColor));
}